

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

OStream * Json::operator<<(OStream *sout,Value *root)

{
  StreamWriter *pSVar1;
  StreamWriterBuilder builder;
  StreamWriterBuilder local_48;
  
  StreamWriterBuilder::StreamWriterBuilder(&local_48);
  pSVar1 = StreamWriterBuilder::newStreamWriter(&local_48);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,root,sout);
  (*pSVar1->_vptr_StreamWriter[1])(pSVar1);
  local_48.super_Factory._vptr_Factory = (_func_int **)&PTR__StreamWriterBuilder_001517b8;
  Value::~Value(&local_48.settings_);
  return sout;
}

Assistant:

OStream& operator<<(OStream& sout, Value const& root) {
  StreamWriterBuilder builder;
  StreamWriterPtr const writer(builder.newStreamWriter());
  writer->write(root, &sout);
  return sout;
}